

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void compact_array_suite::test_int32(void)

{
  int32_t value [4];
  value_type input [18];
  iarchive in;
  undefined4 local_dc;
  int32_t local_d8;
  undefined1 auStack_d4 [4];
  int32_t iStack_d0;
  undefined1 auStack_cc [4];
  uchar local_c8 [32];
  iarchive local_a8;
  
  local_c8[0] = 0xac;
  local_c8[1] = '\x10';
  local_c8[2] = '\x01';
  local_c8[3] = '\x11';
  local_c8[4] = '!';
  local_c8[5] = '1';
  local_c8[6] = '\x02';
  local_c8[7] = '\x12';
  local_c8[8] = '\"';
  local_c8[9] = '2';
  local_c8[10] = '\x03';
  local_c8[0xb] = '\x13';
  local_c8[0xc] = '#';
  local_c8[0xd] = '3';
  local_c8[0xe] = '\x04';
  local_c8[0xf] = '\x14';
  local_c8[0x10] = '$';
  local_c8[0x11] = '4';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[18]>
            (&local_a8,(uchar (*) [18])local_c8);
  local_d8 = 0x7fffffff;
  auStack_d4 = (undefined1  [4])0x7fffffff;
  iStack_d0 = 0x7fffffff;
  auStack_cc = (undefined1  [4])0x7fffffff;
  trial::protocol::serialization::load_overloader<trial::protocol::bintoken::iarchive,_int[4],_void>
  ::load(&local_a8,(int32_t (*) [4])&local_d8,0);
  local_dc = 0x31211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[0]","INT32_C(0x31211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bc,"void compact_array_suite::test_int32()",&local_d8,&local_dc);
  local_dc = 0x32221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[1]","INT32_C(0x32221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bd,"void compact_array_suite::test_int32()",auStack_d4,&local_dc);
  local_dc = 0x33231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[2]","INT32_C(0x33231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1be,"void compact_array_suite::test_int32()",&iStack_d0,&local_dc);
  local_dc = 0x34241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[3]","INT32_C(0x34241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bf,"void compact_array_suite::test_int32()",auStack_cc,&local_dc);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_int32()
{
    const value_type input[] = { token::code::array8_int32, 4 * token::int32::size,
                                 0x01, 0x11, 0x21, 0x31,
                                 0x02, 0x12, 0x22, 0x32,
                                 0x03, 0x13, 0x23, 0x33,
                                 0x04, 0x14, 0x24, 0x34 };
    format::iarchive in(input);
    std::int32_t value[4] = { std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max() };
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT32_C(0x31211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT32_C(0x32221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT32_C(0x33231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT32_C(0x34241404));
}